

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

Polynomial<double> * OpenMD::operator*(Polynomial<double> *p1,Polynomial<double> *p2)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  Polynomial<double> *in_RDI;
  const_iterator j;
  const_iterator i;
  Polynomial<double> *p;
  Polynomial<double> *in_stack_ffffffffffffff38;
  _Rb_tree_const_iterator<std::pair<const_int,_double>_> *in_stack_ffffffffffffff40;
  _Rb_tree_const_iterator<std::pair<const_int,_double>_> *coefficient;
  int exponent;
  undefined4 in_stack_ffffffffffffff60;
  _Self local_60;
  _Base_ptr local_58;
  _Self local_50 [3];
  _Base_ptr local_38;
  undefined1 local_29;
  _Rb_tree_const_iterator<std::pair<const_int,_double>_> local_28;
  _Rb_tree_const_iterator<std::pair<const_int,_double>_> local_20 [4];
  
  std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::_Rb_tree_const_iterator(local_20);
  std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::_Rb_tree_const_iterator(&local_28);
  local_29 = 0;
  Polynomial<double>::Polynomial((Polynomial<double> *)0x462d68);
  local_38 = (_Base_ptr)Polynomial<double>::begin(in_stack_ffffffffffffff38);
  local_20[0]._M_node = local_38;
  while( true ) {
    local_50[0]._M_node = (_Base_ptr)Polynomial<double>::end(in_stack_ffffffffffffff38);
    bVar1 = std::operator!=(local_20,local_50);
    if (!bVar1) break;
    local_58 = (_Base_ptr)Polynomial<double>::begin(in_stack_ffffffffffffff38);
    local_28._M_node = local_58;
    while( true ) {
      local_60._M_node = (_Base_ptr)Polynomial<double>::end(in_stack_ffffffffffffff38);
      bVar1 = std::operator!=(&local_28,&local_60);
      if (!bVar1) break;
      in_stack_ffffffffffffff40 = local_20;
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<const_int,_double>_> *)0x462e48);
      iVar2 = ppVar3->first;
      coefficient = &local_28;
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<const_int,_double>_> *)0x462e60);
      iVar2 = iVar2 + ppVar3->first;
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<const_int,_double>_> *)0x462e79);
      exponent = (int)((ulong)ppVar3->second >> 0x20);
      std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_int,_double>_> *)0x462e8e);
      Polynomial<double>::addCoefficient
                ((Polynomial<double> *)CONCAT44(iVar2,in_stack_ffffffffffffff60),exponent,
                 (double *)coefficient);
      std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator++
                (in_stack_ffffffffffffff40);
    }
    std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator++
              (in_stack_ffffffffffffff40);
  }
  return in_RDI;
}

Assistant:

Polynomial<Real> operator*(const Polynomial<Real>& p1,
                             const Polynomial<Real>& p2) {
    typename Polynomial<Real>::const_iterator i;
    typename Polynomial<Real>::const_iterator j;
    Polynomial<Real> p;

    for (i = p1.begin(); i != p1.end(); ++i) {
      for (j = p2.begin(); j != p2.end(); ++j) {
        p.addCoefficient(i->first + j->first, i->second * j->second);
      }
    }

    return p;
  }